

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  ostringstream *poVar5;
  ostream *poVar6;
  Precision PVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Vector<float,_3>_> *pVVar11;
  pointer pcVar12;
  Variable<tcu::Vector<float,_4>_> *pVVar13;
  Variable<tcu::Matrix<float,_3,_4>_> *pVVar14;
  double dVar15;
  pointer pVVar16;
  bool bVar17;
  int iVar18;
  uint uVar19;
  undefined8 uVar20;
  long lVar21;
  IVal *pIVar22;
  IVal *pIVar23;
  IVal *value;
  undefined8 *puVar24;
  long lVar25;
  long lVar26;
  undefined1 *puVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  int row;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void>_>
  *pBVar29;
  long lVar30;
  _Base_ptr p_Var31;
  FloatFormat *pFVar32;
  Interval *__return_storage_ptr___00;
  TestStatus *pTVar33;
  byte bVar34;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  Environment env;
  IVal reference0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  _Alloc_hider in_stack_fffffffffffffa88;
  _Alloc_hider _Var35;
  size_type sStack_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  IVal local_551;
  TestLog *local_550;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void>_>
  *local_548;
  size_t local_540;
  undefined1 local_538 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  _Rb_tree_node_base *local_518;
  double local_510;
  ulong local_4d8;
  FloatFormat *local_4d0;
  TestStatus *local_4c8;
  string local_4c0;
  long local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  undefined1 local_468 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  double local_448;
  Precision local_440;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_438;
  undefined4 local_430;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void>_>
  local_2e8;
  FloatFormat local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [376];
  
  bVar34 = 0;
  this_00 = this->m_samplings;
  pFVar32 = &(this->m_caseCtx).floatFormat;
  PVar7 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  local_4c8 = __return_storage_ptr__;
  iVar18 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4d0 = pFVar32;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar32,(FloatFormat *)(ulong)PVar7,(Precision)sVar8,(ulong)(iVar18 + 0xdeadbeef),
             (deUint32)SUB84(in_stack_fffffffffffffa88._M_p,0));
  pVVar16 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_540 = ((long)local_278.in0.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_278.in0.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_2e8,local_540);
  local_2b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_550 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2e8.out0.
              super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar5 = (ostringstream *)(local_468 + 8);
  local_468._0_8_ = local_550;
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var4 = (_Rb_tree_node_base *)(local_538 + 8);
  local_538._8_4_ = _S_red;
  local_528._M_allocated_capacity = 0;
  local_510 = 0.0;
  pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_548 = this;
  local_528._8_8_ = p_Var4;
  local_518 = p_Var4;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_538);
  if ((_Rb_tree_node_base *)local_528._8_8_ != p_Var4) {
    uVar20 = local_528._8_8_;
    do {
      (**(code **)(**(long **)(uVar20 + 0x20) + 0x30))(*(long **)(uVar20 + 0x20),local_1a8);
      uVar20 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar20);
    } while ((_Rb_tree_node_base *)uVar20 != p_Var4);
  }
  pBVar29 = local_548;
  if (local_510 != 0.0) {
    poVar5 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,in_stack_fffffffffffffa88._M_p,sStack_570);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffa88._M_p != &local_568) {
      operator_delete(in_stack_fffffffffffffa88._M_p,local_568._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_538);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pSVar10 = (pBVar29->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,local_540,&local_218,&local_288,0);
  lVar21 = 8;
  do {
    *(undefined1 *)((long)&local_540 + lVar21) = 0;
    *(undefined8 *)(local_538 + lVar21) = 0x7ff0000000000000;
    *(undefined8 *)(local_538 + lVar21 + 8) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x50);
  lVar21 = 8;
  do {
    *(undefined1 *)((long)&local_540 + lVar21) = 0;
    *(undefined8 *)(local_538 + lVar21) = 0x7ff0000000000000;
    *(undefined8 *)(local_538 + lVar21 + 8) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x50);
  lVar21 = 8;
  do {
    local_1a8[lVar21 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar21) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar21 + 8) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x68);
  lVar21 = 8;
  do {
    local_1a8[lVar21 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar21) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar21 + 8) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x68);
  tcu::Matrix<tcu::Interval,_3,_4>::Matrix((Matrix<tcu::Interval,_3,_4> *)local_468);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_498,
             (pBVar29->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             (IVal *)local_538);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_498,
             (pBVar29->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar29->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa88);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar29->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c0);
  Environment::bind<tcu::Matrix<float,3,4>>
            ((Environment *)&local_498,
             (pBVar29->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar29->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_551);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar16) {
LAB_0094ac84:
    poVar5 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"All ",4);
    pTVar33 = local_4c8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_3f0);
    local_468._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_468 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    pTVar33->m_code = QP_TEST_RESULT_PASS;
    (pTVar33->m_description)._M_dataplus._M_p = (pointer)&(pTVar33->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar33->m_description,local_468._0_8_,
               (char *)(local_468._0_8_ + CONCAT44(local_468._12_4_,local_468._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_468 + 0x10)) goto LAB_0094ae6b;
    uVar20 = (_Base_ptr)
             CONCAT44(local_458._M_allocated_capacity._4_4_,local_458._M_allocated_capacity._0_4_);
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._0_8_;
  }
  else {
    local_4a0 = local_540 + (local_540 == 0);
    lVar21 = 0;
    local_4d8 = 0;
    pFVar32 = local_4d0;
    do {
      tcu::Matrix<tcu::Interval,_3,_4>::Matrix((Matrix<tcu::Interval,_3,_4> *)local_1a8);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_538,pFVar32,(Vector<float,_3> *)&stack0xfffffffffffffa88);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_468,pFVar32,(IVal *)local_538);
      pIVar22 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_498,
                           (pBVar29->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      puVar24 = (undefined8 *)local_468;
      for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
        *(undefined8 *)pIVar22->m_data = *puVar24;
        puVar24 = puVar24 + (ulong)bVar34 * -2 + 1;
        pIVar22 = (IVal *)((long)pIVar22 + ((ulong)bVar34 * -2 + 1) * 8);
      }
      _Var35._M_p = *(pointer *)
                     local_278.in1.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar21].m_data;
      lVar25 = *(long *)(local_278.in1.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar21].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_538,pFVar32,(Vector<float,_4> *)&stack0xfffffffffffffa88);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,pFVar32,(IVal *)local_538);
      pIVar23 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_498,
                           (pBVar29->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar24 = (undefined8 *)local_468;
      for (lVar26 = 0xc; lVar26 != 0; lVar26 = lVar26 + -1) {
        *(undefined8 *)pIVar23->m_data = *puVar24;
        puVar24 = puVar24 + (ulong)bVar34 * -2 + 1;
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar34 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar29->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar29->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_440 = (pBVar29->m_caseCtx).precision;
      local_448 = pFVar32->m_maxValue;
      local_468._0_8_ = *(undefined8 *)pFVar32;
      local_468._8_4_ = pFVar32->m_fractionBits;
      local_468._12_4_ = pFVar32->m_hasSubnormal;
      local_458._M_allocated_capacity._0_4_ = pFVar32->m_hasInf;
      local_458._M_allocated_capacity._4_4_ = pFVar32->m_hasNaN;
      local_458._8_1_ = pFVar32->m_exactPrecision;
      local_458._9_3_ = *(undefined3 *)&pFVar32->field_0x19;
      local_458._12_4_ = *(undefined4 *)&pFVar32->field_0x1c;
      local_430 = 0;
      pSVar9 = (pBVar29->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      __return_storage_ptr___00 = (Interval *)local_468;
      local_438 = &local_498;
      (*pSVar9->_vptr_Statement[3])(pSVar9,__return_storage_ptr___00);
      value = Environment::lookup<tcu::Matrix<float,3,4>>
                        ((Environment *)&local_498,
                         (pBVar29->m_variables).out0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>
                         .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_4>,_tcu::Matrix<tcu::Interval,_3,_4>_>::doConvert
                ((IVal *)__return_storage_ptr___00,&local_2b8,value);
      puVar27 = local_1a8;
      lVar26 = 0;
      do {
        lVar30 = 0;
        do {
          *(undefined8 *)(puVar27 + lVar30 + 0x10) =
               *(undefined8 *)((long)&__return_storage_ptr___00->m_hi + lVar30);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)
                    &__return_storage_ptr___00->m_hasNaN)->m_data[0].m_data[0].m_hasNaN + lVar30;
          dVar15 = *(double *)(pbVar2 + 8);
          *(undefined8 *)(puVar27 + lVar30) = *(undefined8 *)pbVar2;
          *(double *)((long)(puVar27 + lVar30) + 8) = dVar15;
          lVar30 = lVar30 + 0x48;
        } while (lVar30 != 0x120);
        lVar26 = lVar26 + 1;
        puVar27 = puVar27 + 0x18;
        __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
      } while (lVar26 != 3);
      bVar17 = contains<tcu::Matrix<float,3,4>>
                         ((IVal *)local_1a8,
                          local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar21);
      local_468._0_8_ = local_468 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar17 = tcu::ResultCollector::check(&local_1f8,bVar17,(string *)local_468);
      if ((TestLog *)local_468._0_8_ != (TestLog *)(local_468 + 0x10)) {
        operator_delete((void *)local_468._0_8_,
                        CONCAT44(local_458._M_allocated_capacity._4_4_,
                                 local_458._M_allocated_capacity._0_4_) + 1);
      }
      pFVar32 = local_4d0;
      if ((!bVar17) && (uVar19 = (int)local_4d8 + 1, local_4d8 = (ulong)uVar19, (int)uVar19 < 0x65))
      {
        local_468._0_8_ = local_550;
        poVar5 = (ostringstream *)(local_468 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar11 = (local_548->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                  m_ptr;
        paVar28 = &local_528;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_538._0_8_ = paVar28;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_538._0_8_,
                   CONCAT44(local_538._12_4_,local_538._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)&stack0xfffffffffffffa88,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar21),(Vector<float,_3> *)paVar28)
        ;
        poVar6 = (ostream *)(local_468 + 8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,_Var35._M_p,lVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var35._M_p != &local_568) {
          operator_delete(_Var35._M_p,local_568._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ != &local_528) {
          operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        pVVar13 = (local_548->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr;
        paVar28 = &local_528;
        pcVar12 = (pVVar13->m_name)._M_dataplus._M_p;
        local_538._0_8_ = paVar28;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,pcVar12,pcVar12 + (pVVar13->m_name)._M_string_length);
        poVar6 = (ostream *)(local_468 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)local_538._0_8_,CONCAT44(local_538._12_4_,local_538._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)&stack0xfffffffffffffa88,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar21),(Vector<float,_4> *)paVar28)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,_Var35._M_p,lVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var35._M_p != &local_568) {
          operator_delete(_Var35._M_p,local_568._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ != &local_528) {
          operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        pVVar14 = (local_548->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_4>_>_>.
                  m_ptr;
        paVar28 = &local_528;
        pcVar12 = (pVVar14->m_name)._M_dataplus._M_p;
        local_538._0_8_ = paVar28;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,pcVar12,pcVar12 + (pVVar14->m_name)._M_string_length);
        poVar6 = (ostream *)(local_468 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)local_538._0_8_,CONCAT44(local_538._12_4_,local_538._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
        valueToString<tcu::Matrix<float,3,4>>
                  ((string *)&stack0xfffffffffffffa88,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar21),
                   (Matrix<float,_3,_4> *)paVar28);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,_Var35._M_p,lVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,4>>
                  (&local_4c0,(shaderexecutor *)&local_2b8,(FloatFormat *)local_1a8,(IVal *)paVar28)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var35._M_p != &local_568) {
          operator_delete(_Var35._M_p,local_568._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ != &local_528) {
          operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_468 + 8));
        std::ios_base::~ios_base(local_3f0);
      }
      lVar21 = lVar21 + 1;
      pBVar29 = local_548;
    } while (lVar21 != local_4a0);
    iVar18 = (int)local_4d8;
    if (iVar18 < 0x65) {
      if (iVar18 == 0) goto LAB_0094ac84;
    }
    else {
      poVar5 = (ostringstream *)(local_468 + 8);
      local_468._0_8_ = local_550;
      std::__cxx11::ostringstream::ostringstream(poVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"(Skipped ",9);
      std::ostream::operator<<(poVar5,iVar18 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar5);
      std::ios_base::~ios_base(local_3f0);
    }
    poVar5 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::ostream::operator<<(poVar5,iVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_3f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    std::ostream::operator<<(local_468,iVar18);
    pTVar33 = local_4c8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::ios_base::~ios_base(local_3f8);
    local_468._0_8_ = local_468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468," test failed. Check log for the details","");
    p_Var3 = (_Base_ptr)
             (CONCAT44(local_468._12_4_,local_468._8_4_) +
             CONCAT44(local_538._12_4_,local_538._8_4_));
    uVar20 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._0_8_ != &local_528) {
      uVar20 = local_528._M_allocated_capacity;
    }
    if ((ulong)uVar20 < p_Var3) {
      p_Var31 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_468 + 0x10)) {
        p_Var31 = (_Base_ptr)
                  CONCAT44(local_458._M_allocated_capacity._4_4_,
                           local_458._M_allocated_capacity._0_4_);
      }
      if (p_Var31 < p_Var3) goto LAB_0094ac75;
      puVar24 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_468,0,(char *)0x0,local_538._0_8_);
    }
    else {
LAB_0094ac75:
      puVar24 = (undefined8 *)std::__cxx11::string::_M_append(local_538,local_468._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar24 + 2);
    if ((double *)*puVar24 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar24 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar24 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar24;
    }
    local_1a8._8_8_ = puVar24[1];
    *puVar24 = pdVar1;
    puVar24[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar33->m_code = QP_TEST_RESULT_FAIL;
    (pTVar33->m_description)._M_dataplus._M_p = (pointer)&(pTVar33->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar33->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_468 + 0x10)) {
      operator_delete((void *)local_468._0_8_,
                      CONCAT44(local_458._M_allocated_capacity._4_4_,
                               local_458._M_allocated_capacity._0_4_) + 1);
    }
    uVar20 = local_528._M_allocated_capacity;
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._0_8_ == &local_528) goto LAB_0094ae6b;
  }
  operator_delete(paVar28,(ulong)((long)&((_Base_ptr)uVar20)->_M_color + 1));
LAB_0094ae6b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.
      super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_4>,_std::allocator<tcu::Matrix<float,_3,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar33;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}